

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Encoder.cpp
# Opt level: O2

void __thiscall
Encoder::CopyPartialBufferAndCalculateCRC
          (Encoder *this,BYTE **ptrDstBuffer,size_t *dstSize,BYTE *srcStart,BYTE *srcEnd,
          uint *pBufferCRC,size_t jumpTableSize)

{
  BYTE *dst;
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  undefined4 *puVar4;
  BYTE *count;
  BYTE *sizeInBytes;
  
  dst = *ptrDstBuffer;
  count = srcEnd + (1 - (long)srcStart);
  sizeInBytes = (BYTE *)*dstSize;
  if (sizeInBytes < count) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Encoder.cpp"
                       ,0x5d5,"(dstSize >= srcSize)","dstSize >= srcSize");
    if (!bVar2) goto LAB_003f2378;
    *puVar4 = 0;
    sizeInBytes = (BYTE *)*dstSize;
  }
  memcpy_s(dst,(size_t)sizeInBytes,srcStart,(size_t)count);
  if (count < jumpTableSize) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Encoder.cpp"
                       ,0x5d8,"(srcSize >= jumpTableSize)","srcSize >= jumpTableSize");
    if (!bVar2) {
LAB_003f2378:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  uVar3 = CalculateCRC(*pBufferCRC,(long)count - jumpTableSize,dst);
  *pBufferCRC = uVar3;
  *ptrDstBuffer = *ptrDstBuffer + (long)count;
  *dstSize = *dstSize - (long)count;
  return;
}

Assistant:

void Encoder::CopyPartialBufferAndCalculateCRC(BYTE ** ptrDstBuffer, size_t &dstSize, BYTE * srcStart, BYTE * srcEnd, uint* pBufferCRC, size_t jumpTableSize)
{
    BYTE * destBuffer = *ptrDstBuffer;

    size_t srcSize = srcEnd - srcStart + 1;
    Assert(dstSize >= srcSize);
    memcpy_s(destBuffer, dstSize, srcStart, srcSize);

    Assert(srcSize >= jumpTableSize);

    //Exclude the jump table content (which is at the end of the buffer) for calculating CRC - at this point.
    *pBufferCRC = CalculateCRC(*pBufferCRC, srcSize - jumpTableSize, destBuffer);

    *ptrDstBuffer += srcSize;
    dstSize -= srcSize;
}